

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void copy_suite::partition_copy(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> input;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> bVar1;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> bVar2;
  iterator iVar3;
  iterator second_end;
  iterator iVar4;
  iterator iVar5;
  allocator<int> local_1b9;
  int local_1b8 [2];
  iterator local_1b0;
  size_type local_1a8;
  undefined1 local_1a0 [8];
  vector<int,_std::allocator<int>_> expect_1;
  allocator<int> local_141;
  int local_140 [2];
  iterator local_138;
  size_type local_130;
  undefined1 local_128 [8];
  vector<int,_std::allocator<int>_> expect;
  view_pointer local_e8;
  size_type local_e0;
  view_pointer local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  circular_view<int,_18446744073709551615UL> no_copy;
  int no_copy_array [4];
  circular_view<int,_18446744073709551615UL> yes_copy;
  int yes_copy_array [4];
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  yes_copy_array[2] = 0xb;
  yes_copy_array[3] = 0x16;
  input._M_len = 5;
  input._M_array = yes_copy_array + 2;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)(no_copy_array + 2),
             (value_type (*) [4])&yes_copy.member.next);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_c8,
             (value_type (*) [4])&no_copy.member.next);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = std::back_inserter<vista::circular_view<int,18446744073709551615ul>>
                    ((circular_view<int,_18446744073709551615UL> *)(no_copy_array + 2));
  bVar2 = std::back_inserter<vista::circular_view<int,18446744073709551615ul>>
                    ((circular_view<int,_18446744073709551615UL> *)local_c8);
  local_d8 = iVar4.parent;
  local_d0 = iVar4.current;
  local_e8 = iVar5.parent;
  local_e0 = iVar5.current;
  join_0x00000010_0x00000000_ =
       std::
       partition_copy<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>,copy_suite::partition_copy()::__0>
                 (local_d8,local_d0,local_e8,local_e0,bVar1.container,bVar2.container);
  local_140[0] = 0x16;
  local_140[1] = 0x2c;
  local_138 = local_140;
  local_130 = 2;
  std::allocator<int>::allocator(&local_141);
  __l_00._M_len = local_130;
  __l_00._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_128,__l_00,&local_141);
  std::allocator<int>::~allocator(&local_141);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)(no_copy_array + 2));
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)(no_copy_array + 2));
  iVar3 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_128);
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_128);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x88,"void copy_suite::partition_copy()",iVar4,iVar5,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_128);
  local_1b8[0] = 0x21;
  local_1b8[1] = 0x37;
  local_1b0 = local_1b8;
  local_1a8 = 2;
  std::allocator<int>::allocator(&local_1b9);
  __l._M_len = local_1a8;
  __l._M_array = local_1b0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1a0,__l,&local_1b9);
  std::allocator<int>::~allocator(&local_1b9);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_c8);
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_c8);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_1a0);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_1a0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x8d,"void copy_suite::partition_copy()",iVar4,iVar5,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1a0);
  return;
}

Assistant:

void partition_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    int yes_copy_array[4];
    circular_view<int> yes_copy(yes_copy_array);
    int no_copy_array[4];
    circular_view<int> no_copy(no_copy_array);
    std::partition_copy(span.begin(), span.end(), std::back_inserter(yes_copy), std::back_inserter(no_copy), [](int value) { return value % 2 == 0; });
    {
        std::vector<int> expect = { 22, 44 };
        BOOST_TEST_ALL_EQ(yes_copy.begin(), yes_copy.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> expect = { 33, 55 };
        BOOST_TEST_ALL_EQ(no_copy.begin(), no_copy.end(),
                          expect.begin(), expect.end());
    }
}